

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DefUseManager::EraseUseRecordsOfOperandIds
          (DefUseManager *this,Instruction *inst)

{
  uint32_t *puVar1;
  iterator __it;
  uint32_t *puVar2;
  Instruction *local_48;
  key_type local_40;
  
  local_48 = inst;
  __it = std::
         _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->inst_to_used_ids_)._M_h,&local_48);
  if (__it.
      super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    puVar1 = *(uint32_t **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                     ._M_cur + 0x18);
    for (puVar2 = *(uint32_t **)
                   ((long)__it.
                          super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                          ._M_cur + 0x10); puVar2 != puVar1; puVar2 = puVar2 + 1) {
      local_40.def = GetDef(this,*puVar2);
      local_40.user = local_48;
      std::
      _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
      ::erase(&(this->id_to_users_)._M_t,&local_40);
    }
    std::
    _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->inst_to_used_ids_)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
            ._M_cur);
  }
  return;
}

Assistant:

void DefUseManager::EraseUseRecordsOfOperandIds(const Instruction* inst) {
  // Go through all ids used by this instruction, remove this instruction's
  // uses of them.
  auto iter = inst_to_used_ids_.find(inst);
  if (iter != inst_to_used_ids_.end()) {
    for (auto use_id : iter->second) {
      id_to_users_.erase(
          UserEntry{GetDef(use_id), const_cast<Instruction*>(inst)});
    }
    inst_to_used_ids_.erase(iter);
  }
}